

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O0

void test_writer(string *name)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  type this;
  json *this_00;
  allocator local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j;
  FILE *f;
  string *name_local;
  
  j._M_t.super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>._M_t.
  super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
  super__Head_base<0UL,_argo::json_*,_false>._M_head_impl =
       (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
       fopen("test_files/tmp.json","r");
  iVar2 = fseek((FILE *)j._M_t.super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>.
                        _M_t.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                        super__Head_base<0UL,_argo::json_*,_false>._M_head_impl,0,2);
  if (iVar2 == 0xd) {
    fclose((FILE *)j._M_t.super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>._M_t.
                   super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                   super__Head_base<0UL,_argo::json_*,_false>._M_head_impl);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"test_files/tmp.json",&local_41);
    argo::parser::load((parser *)local_20,(string *)local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator*
                     ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_20);
    this_00 = argo::json::operator[](this,"one");
    bVar1 = argo::json::operator==(this_00,1);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)jlog,"PASS: ");
      poVar3 = std::operator<<(poVar3,(string *)name);
      poVar3 = std::operator<<(poVar3," value of field one is 1");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar3 = std::operator<<((ostream *)jlog,"FAIL: ");
      poVar3 = std::operator<<(poVar3,(string *)name);
      poVar3 = std::operator<<(poVar3," value of field one is not 1");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
              ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_20);
  }
  else {
    poVar3 = std::operator<<((ostream *)jlog,"FAIL: ");
    poVar3 = std::operator<<(poVar3,(string *)name);
    poVar3 = std::operator<<(poVar3," writer file length is not 13 : ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void test_writer(string name)
{
    FILE *f = fopen("test_files/tmp.json", "r");
    if (fseek(f, 0, SEEK_END) != 13)
    {
        jlog << "FAIL: " << name << " writer file length is not 13 : " << endl;
    }
    else
    {
        fclose(f);
        auto j = parser::load("test_files/tmp.json");
        if ((*j)["one"] == 1)
        {
            jlog << "PASS: " << name << " value of field one is 1" << endl;
        }
        else
        {
            jlog << "FAIL: " << name << " value of field one is not 1" << endl;
        }
    }
}